

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

_Bool is_valid_tx_input(wally_tx_input *input)

{
  wally_tx_witness_stack *pwVar1;
  
  if (input == (wally_tx_input *)0x0) {
    return false;
  }
  if ((input->script != (uchar *)0x0) == (input->script_len == 0)) {
    return false;
  }
  pwVar1 = input->witness;
  if (pwVar1 != (wally_tx_witness_stack *)0x0) {
    if (pwVar1->items == (wally_tx_witness_item *)0x0 && pwVar1->items_allocation_len == 0) {
      if (pwVar1->num_items != 0) {
        return false;
      }
    }
    else if ((pwVar1->items != (wally_tx_witness_item *)0x0) != (pwVar1->items_allocation_len != 0))
    {
      return false;
    }
  }
  pwVar1 = input->pegin_witness;
  if (pwVar1 != (wally_tx_witness_stack *)0x0) {
    if (pwVar1->items == (wally_tx_witness_item *)0x0 && pwVar1->items_allocation_len == 0) {
      return pwVar1->num_items == 0;
    }
    return (pwVar1->items != (wally_tx_witness_item *)0x0) == (pwVar1->items_allocation_len != 0);
  }
  return true;
}

Assistant:

static bool is_valid_tx_input(const struct wally_tx_input *input)
{
    return input &&
           BYTES_VALID(input->script, input->script_len) &&
           (!input->witness || is_valid_witness_stack(input->witness))
#ifdef BUILD_ELEMENTS
           && (!input->pegin_witness || is_valid_witness_stack(input->pegin_witness))
#endif
    ;
}